

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer pRVar4;
  ofstream *os_00;
  int iVar5;
  ofstream fout;
  
  iVar3 = 0;
  bVar1 = true;
  for (pRVar4 = (this->RequestedHelpItems).
                super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 != (this->RequestedHelpItems).
                super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pRVar4 = pRVar4 + 1) {
    std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
    std::ofstream::ofstream(&fout);
    if ((pRVar4->Filename)._M_string_length == 0) {
      iVar5 = iVar3 + 1;
      bVar2 = 0 < iVar3;
      os_00 = (ofstream *)os;
      iVar3 = iVar5;
      if (bVar2) {
        std::operator<<(os,"\n\n");
      }
    }
    else {
      std::ofstream::open((char *)&fout,(_Ios_Openmode)(pRVar4->Filename)._M_dataplus._M_p);
      os_00 = &fout;
    }
    bVar2 = PrintDocumentation(this,pRVar4->HelpType,
                               &os_00->super_basic_ostream<char,_std::char_traits<char>_>);
    if ((!bVar2) ||
       (((&(os_00->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20)
         [(long)(os_00->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3]]
        & 5) != 0)) {
      bVar1 = false;
    }
    std::ofstream::~ofstream(&fout);
  }
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (std::vector<RequestedHelpItem>::const_iterator i =
         this->RequestedHelpItems.begin();
       i != this->RequestedHelpItems.end(); ++i) {
    this->CurrentArgument = i->Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!i->Filename.empty()) {
      fout.open(i->Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(i->HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}